

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search2d(ON_RTree *this,double *a_min,double *a_max,ON_SimpleArray<int> *a_result)

{
  undefined1 local_60 [8];
  ON_RTreeBBox rect;
  ON_SimpleArray<int> *a_result_local;
  double *a_max_local;
  double *a_min_local;
  ON_RTree *this_local;
  
  if (this->m_root == (ON_RTreeNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_60 = (undefined1  [8])*a_min;
    rect.m_min[0] = a_min[1];
    rect.m_min[1] = 0.0;
    rect.m_min[2] = *a_max;
    rect.m_max[0] = a_max[1];
    rect.m_max[1] = 0.0;
    rect.m_max[2] = (double)a_result;
    this_local._7_1_ = SearchHelper(this->m_root,(ON_RTreeBBox *)local_60,a_result);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search2d(const double a_min[2], const double a_max[2],
                          ON_SimpleArray<int>& a_result 
                          ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,2*sizeof(a_min[0]));
  rect.m_min[2] = 0.0;
  memcpy(rect.m_max,a_max,2*sizeof(a_max[0]));
  rect.m_max[2] = 0.0;

  return SearchHelper(m_root, &rect,  a_result);
}